

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

void Gia_ManHashStart(Gia_Man_t *p)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  Gia_ManHashAlloc(p);
  Gia_ManCleanValue(p);
  if (0 < p->nObjs) {
    lVar7 = 0;
    iVar5 = 0;
    lVar8 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar1 = *(ulong *)(&p->pObjs->field_0x0 + lVar7);
      uVar3 = (uint)uVar1;
      if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
        if ((int)((int)lVar8 - (uVar3 & 0x1fffffff)) < 0) {
LAB_006b1771:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10b,"int Abc_Var2Lit(int, int)");
        }
        uVar6 = (uint)(uVar1 >> 0x20) & 0x1fffffff;
        if ((int)((int)lVar8 - uVar6) < 0) goto LAB_006b1771;
        if (p->pMuxes == (uint *)0x0) {
          uVar4 = 0xffffffff;
        }
        else {
          uVar4 = p->pMuxes[lVar8];
          uVar4 = -(uint)(uVar4 == 0) | uVar4;
        }
        piVar2 = Gia_ManHashFind(p,iVar5 + (uint)((uVar3 >> 0x1d & 1) != 0) +
                                   (uVar3 & 0x1fffffff) * -2,
                                 iVar5 + (uint)((uVar1 >> 0x3d & 1) != 0) + uVar6 * -2,uVar4);
        if (*piVar2 != 0) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                        ,0x82,"void Gia_ManHashStart(Gia_Man_t *)");
        }
        *piVar2 = iVar5;
      }
      lVar8 = lVar8 + 1;
      iVar5 = iVar5 + 2;
      lVar7 = lVar7 + 0xc;
    } while (lVar8 < p->nObjs);
  }
  return;
}

Assistant:

void Gia_ManHashStart( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int * pPlace, i;
    Gia_ManHashAlloc( p );
    Gia_ManCleanValue( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0(pObj, i), Gia_ObjFaninLit1(pObj, i), Gia_ObjFaninLit2(p, i) );
        assert( *pPlace == 0 );
        *pPlace = Abc_Var2Lit( i, 0 );
    }
}